

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O1

int __thiscall
ncnn::DetectionOutput::forward
          (DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *this_00;
  vector<float,std::allocator<float>> *this_01;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  void *pvVar7;
  iterator __position;
  iterator __position_00;
  Mat *this_02;
  bool bVar8;
  pointer pvVar9;
  int iVar10;
  void *pvVar11;
  pointer pfVar12;
  int *piVar13;
  uint uVar14;
  long lVar15;
  BBoxRect *__args;
  ulong uVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  float *pfVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<int,_std::allocator<int>_> picked;
  Mat bboxes;
  vector<float,_std::allocator<float>_> class_bbox_scores;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_class_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_class_bbox_rects;
  int local_19c;
  vector<float,_std::allocator<float>_> local_198;
  undefined1 local_178 [8];
  undefined8 uStack_170;
  pointer local_168;
  void *local_158;
  iterator iStack_150;
  int *local_148;
  ulong local_140;
  float *local_138;
  float *pfStack_130;
  undefined8 local_128;
  Allocator *pAStack_120;
  undefined8 local_118;
  uint uStack_110;
  int iStack_10c;
  long local_108;
  vector<float,_std::allocator<float>_> local_f8;
  ulong local_d8;
  pointer local_d0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_c8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_98;
  Option *local_90;
  long local_88;
  void *local_80;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  
  local_d0 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  uVar19 = local_d0[2].w;
  local_d8 = (ulong)uVar19;
  uStack_110 = uVar19;
  if ((int)uVar19 < 0) {
    uStack_110 = uVar19 + 3;
  }
  uStack_110 = (int)uStack_110 >> 2;
  local_140 = (ulong)uStack_110;
  pAStack_120 = opt->workspace_allocator;
  local_138 = (float *)0x0;
  pfStack_130 = (float *)0x0;
  local_128 = 4;
  local_118 = 0x400000002;
  iStack_10c = 1;
  lVar18 = (long)(int)(uStack_110 * 4);
  local_108 = lVar18;
  local_98 = top_blobs;
  local_90 = opt;
  if (6 < uVar19 + 3) {
    if (pAStack_120 == (Allocator *)0x0) {
      pvVar11 = malloc(lVar18 * 4 + 0x1c);
      local_138 = (float *)((long)pvVar11 + 0x17U & 0xfffffffffffffff0);
      *(void **)(local_138 + -2) = pvVar11;
    }
    else {
      local_138 = (float *)(*(code *)**(undefined8 **)pAStack_120)(pAStack_120,lVar18 * 4 | 4);
    }
    pfStack_130 = local_138 + lVar18;
    local_138[lVar18] = 1.4013e-45;
  }
  iVar17 = -100;
  if ((local_138 != (float *)0x0) && (iStack_10c * local_108 != 0)) {
    if (3 < (int)local_d8) {
      pvVar11 = local_d0->data;
      pvVar7 = local_d0[2].data;
      iVar17 = local_d0[2].w;
      uVar16 = local_140 & 0xffffffff;
      local_88 = (long)local_118._4_4_ << 2;
      lVar18 = 0;
      pfVar21 = local_138;
      local_80 = pvVar7;
      do {
        uVar4 = *(undefined8 *)((long)pvVar7 + lVar18 + (long)iVar17 * 4);
        uVar5 = *(undefined8 *)((long)pvVar7 + lVar18 + (long)iVar17 * 4 + 8);
        uVar6 = *(undefined8 *)((long)pvVar11 + lVar18);
        local_a8 = CONCAT44((float)((ulong)uVar6 >> 0x20) * (float)((ulong)uVar4 >> 0x20),
                            (float)uVar6 * (float)uVar4);
        uStack_a0 = 0;
        uVar4 = *(undefined8 *)((long)pvVar11 + lVar18 + 8);
        fVar23 = (float)((ulong)uVar4 >> 0x20) * (float)((ulong)uVar5 >> 0x20);
        local_58 = CONCAT44(fVar23,(float)uVar4 * (float)uVar5);
        uStack_50 = 0;
        local_48 = expf(fVar23);
        fVar23 = expf((float)local_58);
        pfVar1 = (float *)((long)local_80 + lVar18);
        fVar25 = pfVar1[2] - *pfVar1;
        fVar26 = pfVar1[3] - pfVar1[1];
        fVar22 = (*pfVar1 + pfVar1[2]) * 0.5 + fVar25 * (float)local_a8;
        fVar24 = (pfVar1[1] + pfVar1[3]) * 0.5 + fVar26 * local_a8._4_4_;
        fVar23 = fVar23 * fVar25 * 0.5;
        fVar25 = local_48 * fVar26 * 0.5;
        *pfVar21 = fVar22 - fVar23;
        pfVar21[1] = fVar24 - fVar25;
        pfVar21[2] = fVar22 + fVar23;
        pfVar21[3] = fVar24 + fVar25;
        lVar18 = lVar18 + 0x10;
        pfVar21 = (float *)((long)pfVar21 + local_88);
      } while (uVar16 << 4 != lVar18);
    }
    local_78.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize(&local_78,(long)this->num_class);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&local_c8,(long)this->num_class);
    if (1 < this->num_class) {
      lVar18 = 1;
      do {
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (float *)0x0;
        local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (float *)0x0;
        if (3 < (int)local_d8) {
          iVar17 = 0;
          do {
            iVar10 = (int)lVar18;
            fVar23 = *(float *)((long)local_d0[1].data +
                               (long)(this->num_class * iVar17 + iVar10) * 4);
            local_158 = (void *)CONCAT44(local_158._4_4_,fVar23);
            if (this->confidence_threshold <= fVar23 && fVar23 != this->confidence_threshold) {
              lVar15 = (long)iVar17 * (long)local_118._4_4_;
              local_178._4_4_ = local_138[lVar15 + 1];
              local_178._0_4_ = local_138[lVar15];
              uStack_170 = (pointer)CONCAT44(local_138[lVar15 + 3],local_138[lVar15 + 2]);
              local_168 = (pointer)CONCAT44(local_168._4_4_,iVar10);
              if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                _M_realloc_insert<ncnn::BBoxRect_const&>
                          ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_198,
                           (iterator)
                           local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(BBoxRect *)local_178);
              }
              else {
                *(int *)((long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish + 0x10) = iVar10;
                *(undefined1 (*) [8])
                 local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_178;
                *(pointer *)
                 ((long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish + 8) = uStack_170;
                local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)((long)local_198.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish + 0x14);
              }
              if (local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_f8,
                           (iterator)
                           local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)&local_158);
              }
              else {
                *local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_158._0_4_;
                local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            iVar17 = iVar17 + 1;
          } while ((int)local_140 != iVar17);
        }
        qsort_descent_inplace<ncnn::BBoxRect>
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_198,&local_f8);
        iVar17 = this->nms_top_k;
        iVar10 = (int)((ulong)((long)local_198.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_198.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        if (SBORROW4(iVar17,iVar10 * -0x33333333) != iVar17 + iVar10 * 0x33333333 < 0) {
          std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                    ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_198,
                     (long)iVar17);
          std::vector<float,_std::allocator<float>_>::resize(&local_f8,(long)this->nms_top_k);
        }
        local_158 = (void *)0x0;
        local_148 = (int *)0x0;
        iStack_150._M_current = (int *)0x0;
        local_a8 = CONCAT44(local_a8._4_4_,this->nms_threshold);
        uVar19 = (int)((long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) * -0x33333333;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)local_178,(long)(int)uVar19,
                   (allocator_type *)&local_19c);
        if ((int)uVar19 < 1) {
          local_19c = 0;
        }
        else {
          pfVar12 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + 2;
          uVar16 = 0;
          do {
            ((float *)local_178)[uVar16] =
                 ((float)((ulong)*(undefined8 *)pfVar12 >> 0x20) -
                 (float)((ulong)*(undefined8 *)(pfVar12 + -2) >> 0x20)) *
                 ((float)*(undefined8 *)pfVar12 - (float)*(undefined8 *)(pfVar12 + -2));
            uVar16 = uVar16 + 1;
            pfVar12 = pfVar12 + 5;
          } while ((uVar19 & 0x7fffffff) != uVar16);
          local_19c = 0;
          if (0 < (int)uVar19) {
            do {
              uVar14 = (uint)((ulong)((long)iStack_150._M_current - (long)local_158) >> 2);
              if ((int)uVar14 < 1) {
LAB_0012b6b7:
                if (iStack_150._M_current == local_148) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_158,iStack_150,&local_19c);
                }
                else {
                  *iStack_150._M_current = local_19c;
                  iStack_150._M_current = iStack_150._M_current + 1;
                }
              }
              else {
                pfVar21 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + (long)local_19c * 5;
                fVar23 = *pfVar21;
                bVar8 = true;
                uVar16 = 0;
                do {
                  lVar15 = (long)*(int *)((long)local_158 + uVar16 * 4);
                  fVar22 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar15 * 5 + 2];
                  fVar24 = 0.0;
                  if (fVar23 <= fVar22) {
                    pfVar1 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar15 * 5;
                    fVar25 = pfVar21[2];
                    fVar26 = *pfVar1;
                    if (fVar26 <= fVar25) {
                      fVar2 = pfVar21[1];
                      fVar27 = pfVar1[3];
                      if (fVar2 <= fVar27) {
                        fVar3 = pfVar21[3];
                        fVar28 = pfVar1[1];
                        if (fVar28 <= fVar3) {
                          if (fVar25 <= fVar22) {
                            fVar22 = fVar25;
                          }
                          if (fVar26 <= fVar23) {
                            fVar26 = fVar23;
                          }
                          if (fVar3 <= fVar27) {
                            fVar27 = fVar3;
                          }
                          if (fVar28 <= fVar2) {
                            fVar28 = fVar2;
                          }
                          fVar24 = (fVar27 - fVar28) * (fVar22 - fVar26);
                        }
                      }
                    }
                  }
                  if ((float)local_a8 <
                      fVar24 / ((((float *)local_178)[local_19c] - fVar24) +
                               ((float *)local_178)[lVar15])) {
                    bVar8 = false;
                  }
                  uVar16 = uVar16 + 1;
                } while ((uVar14 & 0x7fffffff) != uVar16);
                if (bVar8) goto LAB_0012b6b7;
              }
              local_19c = local_19c + 1;
            } while (local_19c < (int)uVar19);
          }
        }
        if (local_178 != (undefined1  [8])0x0) {
          operator_delete((void *)local_178,(long)local_168 - (long)local_178);
        }
        if (0 < (int)((ulong)((long)iStack_150._M_current - (long)local_158) >> 2)) {
          lVar15 = 0;
          do {
            lVar20 = (long)*(int *)((long)local_158 + lVar15 * 4);
            __args = (BBoxRect *)
                     (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar20 * 5);
            this_00 = (vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)
                      (local_78.
                       super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar18);
            __position._M_current = *(BBoxRect **)(this_00 + 8);
            if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
              std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
              _M_realloc_insert<ncnn::BBoxRect_const&>(this_00,__position,__args);
            }
            else {
              (__position._M_current)->label = __args->label;
              fVar23 = __args->ymin;
              fVar22 = __args->xmax;
              fVar24 = __args->ymax;
              (__position._M_current)->xmin = __args->xmin;
              (__position._M_current)->ymin = fVar23;
              (__position._M_current)->xmax = fVar22;
              (__position._M_current)->ymax = fVar24;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x14;
            }
            this_01 = (vector<float,std::allocator<float>> *)
                      (local_c8.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar18);
            __position_00._M_current = *(float **)(this_01 + 8);
            if (__position_00._M_current == *(float **)(this_01 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (this_01,__position_00,
                         local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar20);
            }
            else {
              *__position_00._M_current =
                   local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar20];
              *(float **)(this_01 + 8) = __position_00._M_current + 1;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < (int)((ulong)((long)iStack_150._M_current - (long)local_158) >> 2));
        }
        if (local_158 != (void *)0x0) {
          operator_delete(local_158,(long)local_148 - (long)local_158);
        }
        if (local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < this->num_class);
    }
    local_178 = (undefined1  [8])0x0;
    uStack_170 = (pointer)0x0;
    local_168 = (pointer)0x0;
    local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (1 < this->num_class) {
      lVar18 = 1;
      lVar15 = 0x20;
      do {
        pvVar9 = local_c8.
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>>
                  ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)local_178,uStack_170,
                   *(undefined8 *)
                    ((long)local_78.
                           super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar15 + -8),
                   *(undefined8 *)
                    ((long)&((local_78.
                              super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar15));
        std::vector<float,std::allocator<float>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                  ((vector<float,std::allocator<float>> *)&local_198,
                   local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,*(undefined8 *)((long)pvVar9 + lVar15 + -8),
                   *(undefined8 *)
                    ((long)&(pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar15));
        lVar18 = lVar18 + 1;
        lVar15 = lVar15 + 0x18;
      } while (lVar18 < this->num_class);
    }
    qsort_descent_inplace<ncnn::BBoxRect>
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_178,&local_198);
    iVar17 = this->keep_top_k;
    iVar10 = (int)((ulong)((long)uStack_170 - (long)local_178) >> 2);
    if (SBORROW4(iVar17,iVar10 * -0x33333333) != iVar17 + iVar10 * 0x33333333 < 0) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_178,(long)iVar17);
      std::vector<float,_std::allocator<float>_>::resize(&local_198,(long)this->keep_top_k);
    }
    uVar19 = (int)((long)uStack_170 - (long)local_178 >> 2) * -0x33333333;
    this_02 = (local_98->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_02,6,uVar19,4,local_90->blob_allocator);
    iVar17 = -100;
    if ((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) {
      if ((int)uVar19 < 1) {
        iVar17 = 0;
      }
      else {
        iVar10 = this_02->w;
        piVar13 = (int *)((long)local_178 + 0x10);
        pfVar21 = (float *)((long)this_02->data + 0x14);
        iVar17 = 0;
        uVar16 = 0;
        do {
          fVar23 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar16];
          pfVar21[-5] = (float)*piVar13;
          pfVar21[-4] = fVar23;
          pfVar21[-3] = ((BBoxRect *)(piVar13 + -4))->xmin;
          pfVar21[-2] = (float)piVar13[-3];
          pfVar21[-1] = (float)piVar13[-2];
          *pfVar21 = (float)piVar13[-1];
          uVar16 = uVar16 + 1;
          piVar13 = piVar13 + 5;
          pfVar21 = pfVar21 + iVar10;
        } while ((uVar19 & 0x7fffffff) != uVar16);
      }
    }
    if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_178 != (undefined1  [8])0x0) {
      operator_delete((void *)local_178,(long)local_168 - (long)local_178);
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&local_c8);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector(&local_78);
  }
  if (pfStack_130 != (float *)0x0) {
    LOCK();
    *pfStack_130 = (float)((int)*pfStack_130 + -1);
    UNLOCK();
    if (*pfStack_130 == 0.0) {
      if (pAStack_120 == (Allocator *)0x0) {
        if (local_138 != (float *)0x0) {
          free(*(void **)(local_138 + -2));
        }
      }
      else {
        (**(code **)(*(long *)pAStack_120 + 8))();
      }
    }
  }
  return iVar17;
}

Assistant:

int DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& location = bottom_blobs[0];
    const Mat& confidence = bottom_blobs[1];
    const Mat& priorbox = bottom_blobs[2];

    const int num_prior = priorbox.w / 4;

    // apply location with priorbox
    Mat bboxes;
    bboxes.create(4, num_prior, 4u, opt.workspace_allocator);
    if (bboxes.empty())
        return -100;

    const float* location_ptr = location;
    const float* priorbox_ptr = priorbox.row(0);
    const float* variance_ptr = priorbox.row(1);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_prior; i++)
    {
        const float* loc = location_ptr + i * 4;
        const float* pb = priorbox_ptr + i * 4;
        const float* var = variance_ptr + i * 4;

        float* bbox = bboxes.row(i);

        // CENTER_SIZE
        float pb_w = pb[2] - pb[0];
        float pb_h = pb[3] - pb[1];
        float pb_cx = (pb[0] + pb[2]) * 0.5f;
        float pb_cy = (pb[1] + pb[3]) * 0.5f;

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = exp(var[2] * loc[2]) * pb_w;
        float bbox_h = exp(var[3] * loc[3]) * pb_h;

        bbox[0] = bbox_cx - bbox_w * 0.5f;
        bbox[1] = bbox_cy - bbox_h * 0.5f;
        bbox[2] = bbox_cx + bbox_w * 0.5f;
        bbox[3] = bbox_cy + bbox_h * 0.5f;
    }

    // sort and nms for each class
    std::vector< std::vector<BBoxRect> > all_class_bbox_rects;
    std::vector< std::vector<float> > all_class_bbox_scores;
    all_class_bbox_rects.resize(num_class);
    all_class_bbox_scores.resize(num_class);

    // start from 1 to ignore background class
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 1; i < num_class; i++)
    {
        // filter by confidence_threshold
        std::vector<BBoxRect> class_bbox_rects;
        std::vector<float> class_bbox_scores;

        for (int j = 0; j < num_prior; j++)
        {
            float score = confidence[j * num_class + i];

            if (score > confidence_threshold)
            {
                const float* bbox = bboxes.row(j);
                BBoxRect c = { bbox[0], bbox[1], bbox[2], bbox[3], i };
                class_bbox_rects.push_back(c);
                class_bbox_scores.push_back(score);
            }
        }

        // sort inplace
        qsort_descent_inplace(class_bbox_rects, class_bbox_scores);

        // keep nms_top_k
        if (nms_top_k < (int)class_bbox_rects.size())
        {
            class_bbox_rects.resize(nms_top_k);
            class_bbox_scores.resize(nms_top_k);
        }

        // apply nms
        std::vector<int> picked;
        nms_sorted_bboxes(class_bbox_rects, picked, nms_threshold);

        // select
        for (int j = 0; j < (int)picked.size(); j++)
        {
            int z = picked[j];
            all_class_bbox_rects[i].push_back(class_bbox_rects[z]);
            all_class_bbox_scores[i].push_back(class_bbox_scores[z]);
        }
    }

    // gather all class
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 1; i < num_class; i++)
    {
        const std::vector<BBoxRect>& class_bbox_rects = all_class_bbox_rects[i];
        const std::vector<float>& class_bbox_scores = all_class_bbox_scores[i];

        bbox_rects.insert(bbox_rects.end(), class_bbox_rects.begin(), class_bbox_rects.end());
        bbox_scores.insert(bbox_scores.end(), class_bbox_scores.begin(), class_bbox_scores.end());
    }

    // global sort inplace
    qsort_descent_inplace(bbox_rects, bbox_scores);

    // keep_top_k
    if (keep_top_k < (int)bbox_rects.size())
    {
        bbox_rects.resize(keep_top_k);
        bbox_scores.resize(keep_top_k);
    }

    // fill result
    int num_detected = bbox_rects.size();

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label;
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}